

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTypeProduct::IfcTypeProduct(IfcTypeProduct *this,void **vtt)

{
  void *pvVar1;
  
  IfcTypeObject::IfcTypeObject(&this->super_IfcTypeObject,vtt + 1);
  pvVar1 = vtt[0x10];
  *(void **)&(this->super_IfcTypeObject).field_0xf0 = pvVar1;
  *(void **)(&(this->super_IfcTypeObject).field_0xf0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x11];
  *(undefined8 *)&(this->super_IfcTypeObject).field_0xf8 = 0;
  pvVar1 = *vtt;
  *(void **)&this->super_IfcTypeObject = pvVar1;
  *(void **)(&(this->super_IfcTypeObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcTypeObject).field_0x88 = vtt[0x13];
  (this->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcTypeObject).field_0xf0 = vtt[0x15];
  *(undefined8 *)&(this->super_IfcTypeObject).field_0x100 = 0;
  *(undefined8 *)&this->field_0x108 = 0;
  *(undefined8 *)&this->field_0x109 = 0;
  *(undefined8 *)&this->field_0x111 = 0;
  (this->Tag).ptr._M_dataplus._M_p = (pointer)&(this->Tag).ptr.field_2;
  (this->Tag).ptr._M_string_length = 0;
  (this->Tag).ptr.field_2._M_local_buf[0] = '\0';
  (this->Tag).have = false;
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}